

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

void __thiscall
SeedTree::SeedTree(SeedTree *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *seed,
                  size_t num_leaves,limbo_salt_t *salt,size_t rep_idx)

{
  bool bVar1;
  uint32_t uVar2;
  uchar *salt_00;
  pointer in_RDX;
  vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_RDI;
  reference rVar3;
  reference rVar4;
  type *right;
  type *left;
  size_t i_2;
  size_t last_non_leaf;
  size_t i_1;
  size_t i;
  size_t tree_depth;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffffe20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe40;
  undefined1 __x;
  vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *__new_size;
  undefined7 in_stack_fffffffffffffec0;
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e0;
  ulong local_b0;
  ulong local_a8;
  reference local_80;
  _Bit_type *in_stack_ffffffffffffff90;
  _Bit_type in_stack_ffffffffffffff98;
  _Bit_type *in_stack_ffffffffffffffa8;
  _Bit_type in_stack_ffffffffffffffb0;
  pointer local_48;
  byte local_30;
  
  (in_RDI->
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __new_size = in_RDI;
  std::
  vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::vector((vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            *)0x130a77);
  __x = (undefined1)((ulong)(__new_size + 1) >> 0x38);
  __new_size[1].
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __new_size[2].
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  __new_size[1].
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  __new_size[1].
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __new_size[2].
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x130aab);
  __new_size[2].
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_RDX;
  uVar2 = ceil_log2(0x130acb);
  local_30 = (byte)uVar2 + 1;
  __new_size[3].
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)in_RDX +
                ((long)((1 << (local_30 & 0x1f)) + -1) - (long)(1 << ((byte)uVar2 & 0x1f))));
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)CONCAT17(local_30,in_stack_fffffffffffffec0),
             (size_type)__new_size,(bool)__x);
  rVar3._M_mask = in_stack_ffffffffffffffb0;
  rVar3._M_p = in_stack_ffffffffffffffa8;
  for (local_48 = (pointer)((long)in_RDI[3].
                                  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start - (long)in_RDX);
      rVar4._M_mask = in_stack_ffffffffffffff98, rVar4._M_p = in_stack_ffffffffffffff90,
      local_48 <
      in_RDI[3].
      super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start;
      local_48 = (pointer)((long)&(local_48->
                                  super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                          + 1)) {
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (in_stack_fffffffffffffe40,
                       CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
    std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffa8,true);
  }
  for (salt_00 = (uchar *)((long)in_RDI[3].
                                 super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start - (long)in_RDX);
      salt_00 != (uchar *)0x0; salt_00 = ((limbo_salt_t *)((long)salt_00 + -0x20))->_M_elems + 0x1f)
  {
    bVar1 = node_exists((SeedTree *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                        (size_t)in_stack_fffffffffffffe30);
    if ((bVar1) ||
       (bVar1 = node_exists((SeedTree *)
                            CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                            (size_t)in_stack_fffffffffffffe30), bVar1)) {
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (in_stack_fffffffffffffe40,
                         CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffff90,true);
    }
  }
  local_80 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_fffffffffffffe40,
                        CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
  std::_Bit_reference::operator=(&local_80,true);
  std::
  vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::resize((vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            *)in_stack_fffffffffffffe40,
           CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
  std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_true>
            ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             in_stack_fffffffffffffe20,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
  std::
  vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::operator[](in_RDI,0);
  std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator=
            ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             in_stack_fffffffffffffe20,
             (optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
  std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
            ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)0x130d63);
  local_a8 = get_parent((size_t)((long)&in_RDI[3].
                                        super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[-1].
                                        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                                + 0x1f));
  for (local_b0 = 0; local_b0 <= local_a8; local_b0 = local_b0 + 1) {
    in_stack_fffffffffffffe3f =
         node_exists((SeedTree *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                     (size_t)in_stack_fffffffffffffe30);
    if ((bool)in_stack_fffffffffffffe3f) {
      std::
      vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::operator[](in_RDI,local_b0);
      in_stack_fffffffffffffe30 =
           std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::value
                     ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                      in_stack_fffffffffffffe20);
      expandSeed((SeedTree *)rVar3._M_mask,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)rVar3._M_p,
                 (limbo_salt_t *)salt_00,rVar4._M_mask,(size_t)rVar4._M_p);
      in_stack_fffffffffffffe20 = &local_e0;
      std::
      get<0ul,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)0x130e35);
      std::
      get<1ul,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)0x130e47);
      bVar1 = node_exists((SeedTree *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                          (size_t)in_stack_fffffffffffffe30);
      if (bVar1) {
        std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
        optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_true>
                  ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                   in_stack_fffffffffffffe20,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
        std::
        vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::operator[](in_RDI,local_b0 * 2 + 1);
        std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator=
                  ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                   in_stack_fffffffffffffe20,
                   (optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                   CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
        std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
                  ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)0x130ec3
                  );
      }
      in_stack_fffffffffffffe1f =
           node_exists((SeedTree *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                       (size_t)in_stack_fffffffffffffe30);
      if ((bool)in_stack_fffffffffffffe1f) {
        std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
        optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_true>
                  ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                   in_stack_fffffffffffffe20,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
        std::
        vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::operator[](in_RDI,local_b0 * 2 + 2);
        std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator=
                  ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                   in_stack_fffffffffffffe20,
                   (optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                   CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
        std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
                  ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)0x130f5f
                  );
      }
      std::
      pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~pair(in_stack_fffffffffffffe20);
    }
  }
  return;
}

Assistant:

SeedTree::SeedTree(std::vector<uint8_t> seed, const size_t num_leaves,
                   const limbo_salt_t &salt, const size_t rep_idx)
    : _data(), _node_exists(), _num_leaves(num_leaves) {
  size_t tree_depth = 1 + ceil_log2(num_leaves);

  _num_total_nodes =
      ((1 << (tree_depth)) - 1) -
      ((1 << (tree_depth - 1)) -
       num_leaves); /* Num nodes in complete - number of missing leaves */

  _node_exists.resize(_num_total_nodes);
  for (size_t i = _num_total_nodes - num_leaves; i < _num_total_nodes; i++) {
    _node_exists[i] = true;
  }

  for (size_t i = _num_total_nodes - num_leaves; i > 0; i--) {
    if (node_exists(2 * i + 1) || node_exists(2 * i + 2)) {
      _node_exists[i] = true;
    }
  }
  _node_exists[0] = true;
  // push back root seed
  _data.resize(_num_total_nodes);
  _data[0] = std::optional(seed);

  size_t last_non_leaf = get_parent(_num_total_nodes - 1);
  for (size_t i = 0; i <= last_non_leaf; i++) {
    if (!node_exists(i))
      continue;
    auto [left, right] = expandSeed(_data[i].value(), salt, rep_idx, i);
    if (node_exists(2 * i + 1)) {
      _data[2 * i + 1] = std::optional(left);
    }
    if (node_exists(2 * i + 2)) {
      _data[2 * i + 2] = std::optional(right);
    }
  }
}